

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_geometry_device.cpp
# Opt level: O3

Vec3fa __thiscall
embree::getVertex(embree *this,GridMesh *gmesh,RTCGeometry subdiv,Grid *hgrids,int firstHalfEdge,
                 int f,int i,int x,int y,Vec3fa *opt)

{
  Grid *pGVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined8 in_XMM1_Qa;
  Vec3fa VVar7;
  
  if (x < 0) {
    iVar5 = rtcGetGeometryPreviousHalfEdge(subdiv,firstHalfEdge);
    iVar4 = rtcGetGeometryOppositeHalfEdge(subdiv,0,iVar5);
    if (iVar4 != iVar5) {
      opt = gmesh->vertices +
            (int)(y * hgrids[iVar4].strideX + hgrids[iVar4].startVertexID + hgrids[iVar4].strideY);
    }
    goto LAB_0011e1c2;
  }
  if (y < 0) {
    iVar5 = rtcGetGeometryOppositeHalfEdge(subdiv,0,firstHalfEdge);
    if (iVar5 == firstHalfEdge) goto LAB_0011e1c2;
    iVar5 = rtcGetGeometryNextHalfEdge(subdiv,iVar5);
    lVar6 = (long)iVar5;
    iVar4 = hgrids[lVar6].strideY;
    iVar5 = hgrids[lVar6].strideX;
  }
  else {
    if ((int)hgrids[firstHalfEdge].width <= x) {
      iVar5 = rtcGetGeometryNextHalfEdge(subdiv,firstHalfEdge);
      opt = gmesh->vertices +
            (int)(y * hgrids[iVar5].strideX + hgrids[iVar5].startVertexID +
                 (hgrids[iVar5].height - 2) * hgrids[iVar5].strideY);
      goto LAB_0011e1c2;
    }
    if (y < (int)hgrids[firstHalfEdge].height) {
      pGVar1 = hgrids + firstHalfEdge;
      opt = gmesh->vertices +
            (int)(x * pGVar1->strideX + pGVar1->startVertexID + y * pGVar1->strideY);
      goto LAB_0011e1c2;
    }
    iVar5 = rtcGetGeometryPreviousHalfEdge(subdiv,firstHalfEdge);
    lVar6 = (long)iVar5;
    iVar4 = hgrids[lVar6].strideY;
    iVar5 = (hgrids[lVar6].height - 2) * hgrids[lVar6].strideX;
  }
  opt = gmesh->vertices + (int)(iVar5 + hgrids[lVar6].startVertexID + x * iVar4);
LAB_0011e1c2:
  uVar2 = *(undefined8 *)&opt->field_0;
  uVar3 = *(undefined8 *)((long)&opt->field_0 + 8);
  *(undefined8 *)this = uVar2;
  *(undefined8 *)(this + 8) = uVar3;
  VVar7.field_0._8_8_ = in_XMM1_Qa;
  VVar7.field_0._0_8_ = uVar2;
  return (Vec3fa)VVar7.field_0;
}

Assistant:

Vec3fa getVertex(GridMesh& gmesh, RTCGeometry subdiv, Grid *hgrids, int firstHalfEdge, int f, int i, int x, int y, const Vec3fa& opt)
{
  int width  = (int)hgrids[firstHalfEdge].width;
  int height = (int)hgrids[firstHalfEdge].height;
  if (x < 0) {
    assert(x == -1 && y >= 0 && y < height);
    int edge = rtcGetGeometryPreviousHalfEdge(subdiv,firstHalfEdge);
    int oedge = rtcGetGeometryOppositeHalfEdge(subdiv,0,edge);
    if (oedge == edge) return opt; // return alternative vertex when requested vertex does not exist
    return getVertex(gmesh,hgrids[oedge],y,1);
  }
  else if (y < 0) {
    assert(y == -1 && x >= 0 && x < width);
    int oedge = rtcGetGeometryOppositeHalfEdge(subdiv,0,firstHalfEdge);
    if (oedge == firstHalfEdge) return opt; // return alternative vertex when requested vertex does not exist
    int noedge = rtcGetGeometryNextHalfEdge(subdiv,oedge);
    return getVertex(gmesh,hgrids[noedge],1,x);
  }
  else if (x >= width) {
    assert(x == width && y >= 0 && y < height);
    int nedge = rtcGetGeometryNextHalfEdge(subdiv,firstHalfEdge);
    return getVertex(gmesh,hgrids[nedge],y,hgrids[nedge].height-2);
  }
  else if (y >= height) {
    assert(y == height && x >= 0 && x < width);
    int pedge = rtcGetGeometryPreviousHalfEdge(subdiv,firstHalfEdge);
    return getVertex(gmesh,hgrids[pedge],hgrids[pedge].height-2,x);
  }
  else {
    return getVertex(gmesh,hgrids[firstHalfEdge],x,y);
  }
}